

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face_conflict *aface
                   ,FT_Bool test_mac_fonts)

{
  undefined8 *puVar1;
  uint uVar2;
  FT_Driver driver;
  FT_Memory pFVar3;
  FT_Face_Internal pFVar4;
  FT_Bitmap_Size *pFVar5;
  bool bVar6;
  FT_Library library_00;
  FT_Face face_00;
  uint uVar7;
  int iVar8;
  FT_Error FVar9;
  FT_ListNode node;
  ulong uVar10;
  short sVar11;
  FT_Open_Args *pFVar12;
  ulong uVar13;
  byte bVar14;
  FT_Stream pFVar15;
  FT_Int num_params;
  undefined7 in_register_00000081;
  FT_Parameter *params;
  FT_Parameter *pFVar16;
  uint uVar17;
  FT_Module *ppFVar18;
  long lVar19;
  FT_Memory memory;
  bool bVar20;
  uint local_1c4;
  FT_Open_Args *local_1c0;
  FT_Stream local_1b8;
  FT_Stream stream;
  FT_Library local_1a8;
  FT_Driver local_1a0;
  FT_Face_conflict *local_198;
  FT_Face face;
  FT_Memory local_188;
  uint local_180;
  int local_17c;
  FT_Stream local_178;
  FT_Long local_170;
  char *file_names [9];
  char local_11e;
  char local_116;
  byte local_115;
  byte local_114;
  byte local_113;
  byte local_112;
  FT_Error errors [9];
  FT_Open_Args args2;
  FT_Long offsets [9];
  
  local_1b8 = (FT_Stream)
              CONCAT44(local_1b8._4_4_,(int)CONCAT71(in_register_00000081,test_mac_fonts));
  stream = (FT_Stream)0x0;
  face = (FT_Face)0x0;
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  if (-1 < face_index && aface == (FT_Face_conflict *)0x0) {
    return 6;
  }
  if ((args->flags & 2) == 0) {
    bVar20 = false;
  }
  else {
    bVar20 = args->stream != (FT_Stream)0x0;
  }
  uVar7 = FT_Stream_New(library,args,&stream);
  uVar17 = (uint)bVar20;
  local_1c0 = args;
  local_1a8 = library;
  if (uVar7 == 0) {
    memory = library->memory;
    local_1c4 = uVar7;
    if (((args->flags & 8) == 0) ||
       (local_1a0 = (FT_Driver)args->driver, local_1a0 == (FT_Driver)0x0)) {
      uVar2 = library->num_modules;
      local_1a0 = (FT_Driver)0x0;
      local_198 = aface;
      local_188 = memory;
      uVar7 = 0xb;
      for (ppFVar18 = library->modules; aface = local_198, memory = local_188,
          ppFVar18 < library->modules + uVar2; ppFVar18 = ppFVar18 + 1) {
        driver = (FT_Driver)*ppFVar18;
        if ((((driver->root).clazz)->module_flags & 1) != 0) {
          if ((args->flags & 0x10) == 0) {
            params = (FT_Parameter *)0x0;
            pFVar16 = (FT_Parameter *)0x0;
          }
          else {
            params = (FT_Parameter *)(ulong)(uint)args->num_params;
            pFVar16 = args->params;
          }
          local_1a0 = driver;
          uVar7 = open_face(driver,&stream,bVar20,face_index,(FT_Int)params,pFVar16,&face);
          if (uVar7 == 0) {
            local_1c4 = 0;
            aface = local_198;
            memory = local_188;
            goto LAB_00133ad8;
          }
          if ((((char)local_1b8 != '\0') &&
              (iVar8 = strcmp((*ppFVar18)->clazz->module_name,"truetype"), pFVar15 = stream,
              (char)uVar7 == -0x72)) && (iVar8 == 0)) {
            uVar7 = FT_Stream_Seek(stream,0);
            args = local_1c0;
            aface = local_198;
            memory = local_188;
            if (uVar7 != 0) break;
            uVar7 = open_face_PS_from_sfnt_stream
                              (local_1a8,pFVar15,face_index,(FT_Int)local_198,params,
                               (FT_Face_conflict *)pFVar16);
            if (uVar7 == 0) goto LAB_001339b6;
          }
          args = local_1c0;
          aface = local_198;
          memory = local_188;
          if ((char)uVar7 != '\x02') break;
        }
      }
      goto LAB_00133737;
    }
    if ((((local_1a0->root).clazz)->module_flags & 1) == 0) {
      local_1c4 = 0x20;
    }
    else {
      if ((args->flags & 0x10) == 0) {
        num_params = 0;
        pFVar16 = (FT_Parameter *)0x0;
      }
      else {
        num_params = args->num_params;
        pFVar16 = args->params;
      }
      local_1c4 = open_face(local_1a0,&stream,bVar20,face_index,num_params,pFVar16,&face);
      if (local_1c4 == 0) {
LAB_00133ad8:
        node = (FT_ListNode)ft_mem_alloc(memory,0x18,(FT_Error *)&local_1c4);
        face_00 = face;
        if (local_1c4 == 0) {
          node->data = face;
          FT_List_Add(&face->driver->faces_list,node);
          if (-1 < face_index) {
            uVar17 = FT_New_GlyphSlot(face_00,(FT_GlyphSlot *)0x0);
            if ((uVar17 != 0) || (uVar17 = FT_New_Size(face_00,(FT_Size *)file_names), uVar17 != 0))
            goto LAB_00133b43;
            face_00->size =
                 (FT_Size)CONCAT62(file_names[0]._2_6_,
                                   CONCAT11(file_names[0]._1_1_,(char)file_names[0]));
          }
          uVar10 = face_00->face_flags;
          if ((uVar10 & 1) != 0) {
            sVar11 = face_00->height;
            if (sVar11 < 0) {
              sVar11 = -sVar11;
              face_00->height = sVar11;
            }
            if ((uVar10 & 0x20) == 0) {
              face_00->max_advance_height = sVar11;
            }
          }
          if ((uVar10 & 2) != 0) {
            uVar13 = 0;
            uVar10 = (ulong)(uint)face_00->num_fixed_sizes;
            if (face_00->num_fixed_sizes < 1) {
              uVar10 = uVar13;
            }
            for (; uVar10 * 0x20 != uVar13; uVar13 = uVar13 + 0x20) {
              pFVar5 = face_00->available_sizes;
              sVar11 = *(short *)((long)&pFVar5->height + uVar13);
              if (sVar11 < 0) {
                sVar11 = -sVar11;
                *(short *)((long)&pFVar5->height + uVar13) = sVar11;
                bVar14 = (byte)((ushort)sVar11 >> 0xf);
              }
              else {
                bVar14 = 0;
              }
              lVar19 = *(long *)((long)&pFVar5->x_ppem + uVar13);
              if (lVar19 < 0) {
                *(long *)((long)&pFVar5->x_ppem + uVar13) = -lVar19;
              }
              lVar19 = *(long *)((long)&pFVar5->y_ppem + uVar13);
              if (lVar19 < 0) {
                *(long *)((long)&pFVar5->y_ppem + uVar13) = -lVar19;
              }
              if (bVar14 != 0) {
                *(undefined4 *)((long)&pFVar5->height + uVar13) = 0;
                puVar1 = (undefined8 *)((long)&pFVar5->size + uVar13);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined8 *)((long)&pFVar5->y_ppem + uVar13) = 0;
              }
            }
          }
          pFVar4 = face_00->internal;
          (pFVar4->transform_matrix).xx = 0x10000;
          (pFVar4->transform_matrix).xy = 0;
          (pFVar4->transform_matrix).yx = 0;
          (pFVar4->transform_matrix).yy = 0x10000;
          (pFVar4->transform_delta).x = 0;
          (pFVar4->transform_delta).y = 0;
          pFVar4->refcount = 1;
          pFVar4->no_stem_darkening = -1;
          if (aface != (FT_Face_conflict *)0x0) {
            *aface = face_00;
            return 0;
          }
          FT_Done_Face(face_00);
          return 0;
        }
        uVar7 = local_1c4;
        uVar17 = local_1c4;
        if (node != (FT_ListNode)0x0) {
LAB_00133b43:
          FT_Done_Face(face_00);
          return uVar17;
        }
        goto LAB_0013398d;
      }
    }
  }
  else {
    local_1a0 = (FT_Driver)0x0;
    memory = (FT_Memory)0x0;
LAB_00133737:
    pFVar15 = stream;
    local_1c4 = uVar7;
    if ((((char)uVar7 == '\x02') || ((uVar7 & 0xff) == 0x55)) || ((uVar7 & 0xff) == 0x51)) {
      if ((char)local_1b8 != '\0') {
        local_1b8 = stream;
        if (stream == (FT_Stream)0x0) {
          uVar7 = 0x55;
LAB_001337db:
          if ((args->flags & 4) != 0) {
            pFVar3 = local_1a8->memory;
            local_178 = (FT_Stream)0x0;
            local_188 = memory;
            local_180 = uVar17;
            local_170 = face_index;
            FT_Raccess_Guess(local_1a8,local_1b8,args->pathname,file_names,offsets,errors);
            FVar9 = 2;
            bVar20 = false;
            pFVar12 = local_1c0;
            local_198 = aface;
            for (lVar19 = 0; library_00 = local_1a8, lVar19 != 0x24; lVar19 = lVar19 + 4) {
              uVar17 = (&ft_raccess_guess_table[0].type)[lVar19] + ~FT_RFork_Rule_darwin_ufs_export;
              bVar6 = bVar20;
              if (((1 < uVar17) || (!bVar20)) && (*(int *)((long)errors + lVar19) == 0)) {
                args2.flags = 4;
                args2.pathname = *(FT_String **)((long)file_names + lVar19 * 2);
                if (args2.pathname == (FT_String *)0x0) {
                  args2.pathname = pFVar12->pathname;
                }
                FVar9 = FT_Stream_New(local_1a8,&args2,&local_178);
                pFVar15 = local_178;
                if ((char)FVar9 == 'Q') {
                  bVar6 = true;
                }
                if (1 < uVar17) {
                  bVar6 = bVar20;
                }
                pFVar12 = local_1c0;
                if (FVar9 == 0) {
                  local_17c = IsMacResource(library_00,local_178,
                                            *(FT_Long *)((long)offsets + lVar19 * 2),local_170,
                                            local_198);
                  FVar9 = 0;
                  FT_Stream_Free(pFVar15,0);
                  if (local_17c == 0) break;
                  pFVar12 = local_1c0;
                  FVar9 = local_17c;
                  bVar6 = bVar20;
                  if (uVar17 < 2) {
                    bVar6 = true;
                  }
                }
              }
              bVar20 = bVar6;
            }
            pFVar15 = local_1b8;
            for (lVar19 = 0; lVar19 != 9; lVar19 = lVar19 + 1) {
              if (file_names[lVar19] != (char *)0x0) {
                (*pFVar3->free)(pFVar3,file_names[lVar19]);
                file_names[lVar19] = (char *)0x0;
              }
            }
            uVar17 = local_180;
            if (FVar9 == 0) goto LAB_001339b6;
            uVar7 = 2;
            memory = local_188;
            goto LAB_00133973;
          }
        }
        else {
          uVar7 = FT_Stream_Seek(stream,0);
          if (uVar7 == 0) {
            uVar7 = FT_Stream_Read(pFVar15,(FT_Byte *)file_names,0x80);
            if (uVar7 != 0) goto LAB_001337a3;
            if ((((((char)file_names[0] == '\0') && (local_11e == '\0')) && (local_116 == '\0')) &&
                ((0xde < (byte)(file_names[0]._1_1_ - 0x22) && (file_names[7]._7_1_ == '\0')))) &&
               (-1 < (char)local_115 &&
                *(FT_Byte *)((ulong)file_names[0]._1_1_ + 2 + (long)file_names) == '\0')) {
              uVar7 = IsMacResource(local_1a8,local_1b8,
                                    ((ulong)((uint)local_113 << 8 |
                                            (uint)local_114 << 0x10 | (uint)local_115 << 0x18) +
                                     (ulong)local_112 + 0x7f & 0xffffffffffffff80) + 0x80,face_index
                                    ,aface);
              goto LAB_001337a3;
            }
LAB_001337a9:
            uVar7 = IsMacResource(local_1a8,local_1b8,0,face_index,aface);
          }
          else {
LAB_001337a3:
            if ((char)uVar7 == '\x02') goto LAB_001337a9;
          }
          args = local_1c0;
          if (((char)uVar7 == 'U') || ((uVar7 & 0xff) == 2)) goto LAB_001337db;
        }
        pFVar15 = local_1b8;
        if (uVar7 == 0) {
LAB_001339b6:
          FT_Stream_Free(pFVar15,uVar17);
          return 0;
        }
      }
LAB_00133973:
      local_1c4 = uVar7;
      if ((char)uVar7 == '\x02') {
        local_1c4 = 2;
      }
    }
  }
  uVar7 = local_1c4;
  FT_Stream_Free(stream,uVar17);
LAB_0013398d:
  if (face != (FT_Face)0x0) {
    destroy_face(memory,face,local_1a0);
    uVar7 = local_1c4;
  }
  return uVar7;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }